

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::compiler::Declaration::Builder::initField(Builder *__return_storage_ptr__,Builder *this)

{
  void *pvVar1;
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  WirePointer *pWVar4;
  StructPointerCount SVar5;
  undefined2 uVar6;
  PointerBuilder local_38;
  
  pvVar1 = (this->_builder).data;
  *(undefined2 *)((long)pvVar1 + 2) = 6;
  *(undefined2 *)((long)pvVar1 + 0xc) = 0;
  local_38.pointer = (this->_builder).pointers + 5;
  local_38.segment = (this->_builder).segment;
  local_38.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::clear(&local_38);
  local_38.pointer = (this->_builder).pointers + 6;
  local_38.segment = (this->_builder).segment;
  local_38.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::clear(&local_38);
  SVar5 = (this->_builder).pointerCount;
  uVar6 = *(undefined2 *)&(this->_builder).field_0x26;
  (__return_storage_ptr__->_builder).dataSize = (this->_builder).dataSize;
  (__return_storage_ptr__->_builder).pointerCount = SVar5;
  *(undefined2 *)&(__return_storage_ptr__->_builder).field_0x26 = uVar6;
  pSVar2 = (this->_builder).segment;
  pCVar3 = (this->_builder).capTable;
  pWVar4 = (this->_builder).pointers;
  (__return_storage_ptr__->_builder).data = (this->_builder).data;
  (__return_storage_ptr__->_builder).pointers = pWVar4;
  (__return_storage_ptr__->_builder).segment = pSVar2;
  (__return_storage_ptr__->_builder).capTable = pCVar3;
  return __return_storage_ptr__;
}

Assistant:

inline typename Declaration::Field::Builder Declaration::Builder::initField() {
  _builder.setDataField<Declaration::Which>(
      ::capnp::bounded<1>() * ::capnp::ELEMENTS, Declaration::FIELD);
  _builder.setDataField< ::uint16_t>(::capnp::bounded<6>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<5>() * ::capnp::POINTERS).clear();
  _builder.getPointerField(::capnp::bounded<6>() * ::capnp::POINTERS).clear();
  return typename Declaration::Field::Builder(_builder);
}